

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_extension_operator.cpp
# Opt level: O3

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExtensionOperator::Deserialize
          (LogicalExtensionOperator *this,Deserializer *deserializer)

{
  pointer puVar1;
  _Alloc_hider _Var2;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> _Var3;
  int iVar4;
  ClientContext *context;
  DBConfig *pDVar5;
  pointer pOVar6;
  SerializationException *this_00;
  pointer this_01;
  bool bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> extension_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> local_60;
  Deserializer *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_60._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
       (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)this;
  context = Deserializer::Get<duckdb::ClientContext&>(deserializer);
  pDVar5 = DBConfig::GetConfig(context);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"extension_name");
  (*deserializer->_vptr_Deserializer[0x1a])(&local_50,deserializer);
  local_58 = deserializer;
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_01 = (pDVar5->operator_extensions).
            super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pDVar5->operator_extensions).
           super_vector<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_01 != puVar1) {
    do {
      pOVar6 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
               ::operator->(this_01);
      (*(code *)**(undefined8 **)pOVar6)(&local_80,pOVar6);
      _Var2._M_p = local_80._M_dataplus._M_p;
      if (local_80._M_string_length == local_50._M_string_length) {
        if (local_80._M_string_length == 0) {
          bVar7 = true;
        }
        else {
          iVar4 = bcmp(local_80._M_dataplus._M_p,local_50._M_dataplus._M_p,local_80._M_string_length
                      );
          bVar7 = iVar4 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_80.field_2) {
        operator_delete(_Var2._M_p);
      }
      if (bVar7) {
        pOVar6 = unique_ptr<duckdb::OperatorExtension,_std::default_delete<duckdb::OperatorExtension>,_true>
                 ::operator->(this_01);
        (**(code **)(*(long *)pOVar6 + 8))(&local_80,pOVar6,local_58);
        _Var3._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             local_60._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        *(pointer *)
         local_60._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
             local_80._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
               (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                )_Var3._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_80,"No deserialization method exists for extension: ",&local_50);
  SerializationException::SerializationException(this_00,&local_80);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<LogicalOperator> LogicalExtensionOperator::Deserialize(Deserializer &deserializer) {
	auto &config = DBConfig::GetConfig(deserializer.Get<ClientContext &>());
	auto extension_name = deserializer.ReadProperty<string>(200, "extension_name");
	for (auto &extension : config.operator_extensions) {
		if (extension->GetName() == extension_name) {
			return extension->Deserialize(deserializer);
		}
	}
	throw SerializationException("No deserialization method exists for extension: " + extension_name);
}